

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O2

anon_class_40_5_d6c92a71 *
qclab::qgates::lambda_QGate1<double>
          (anon_class_40_5_d6c92a71 *__return_storage_ptr__,Op op,SquareMatrix<double> *mat1,
          double *vector)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  if (mat1->size_ == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,mat1);
    pdVar1 = (mat1->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    uVar8 = *(undefined4 *)pdVar1;
    uVar9 = *(undefined4 *)((long)pdVar1 + 4);
    uVar6 = *(undefined4 *)(pdVar1 + 1);
    uVar7 = *(undefined4 *)((long)pdVar1 + 0xc);
    pdVar1 = pdVar1 + mat1->size_;
    uVar2 = *(undefined4 *)pdVar1;
    uVar3 = *(undefined4 *)((long)pdVar1 + 4);
    uVar4 = *(undefined4 *)(pdVar1 + 1);
    uVar5 = *(undefined4 *)((long)pdVar1 + 0xc);
    __return_storage_ptr__->vector = vector;
    *(undefined4 *)&__return_storage_ptr__->m21 = uVar6;
    *(undefined4 *)((long)&__return_storage_ptr__->m21 + 4) = uVar7;
    *(undefined4 *)&__return_storage_ptr__->m22 = uVar4;
    *(undefined4 *)((long)&__return_storage_ptr__->m22 + 4) = uVar5;
    *(undefined4 *)&__return_storage_ptr__->m11 = uVar8;
    *(undefined4 *)((long)&__return_storage_ptr__->m11 + 4) = uVar9;
    *(undefined4 *)&__return_storage_ptr__->m12 = uVar2;
    *(undefined4 *)((long)&__return_storage_ptr__->m12 + 4) = uVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = double]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }